

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcprs.cpp
# Opt level: O0

int __thiscall CTPNCodeBodyBase::get_or_add_ctx_var_for_level(CTPNCodeBodyBase *this,int level)

{
  int iVar1;
  CTcCodeBodyCtx *this_00;
  int in_ESI;
  long in_RDI;
  CTcCodeBodyCtx *ctx;
  CTcPrsMem *in_stack_ffffffffffffffc8;
  size_t in_stack_ffffffffffffffd0;
  int *local_20;
  
  local_20 = *(int **)(in_RDI + 0x88);
  while( true ) {
    if (local_20 == (int *)0x0) {
      this_00 = (CTcCodeBodyCtx *)operator_new(in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8);
      CTcCodeBodyCtx::CTcCodeBodyCtx(this_00);
      this_00->level_ = in_ESI;
      iVar1 = CTcParser::alloc_ctx_holder_var((CTcParser *)0x2af0a0);
      this_00->var_num_ = iVar1;
      iVar1 = CTcParser::get_max_local_cnt(G_prs);
      *(int *)(in_RDI + 0x98) = iVar1;
      this_00->prv_ = *(CTcCodeBodyCtx **)(in_RDI + 0x90);
      this_00->nxt_ = (CTcCodeBodyCtx *)0x0;
      if (*(long *)(in_RDI + 0x90) == 0) {
        *(CTcCodeBodyCtx **)(in_RDI + 0x88) = this_00;
      }
      else {
        *(CTcCodeBodyCtx **)(*(long *)(in_RDI + 0x90) + 8) = this_00;
      }
      *(CTcCodeBodyCtx **)(in_RDI + 0x90) = this_00;
      return this_00->var_num_;
    }
    if (*local_20 == in_ESI) break;
    local_20 = *(int **)(local_20 + 2);
  }
  return local_20[1];
}

Assistant:

int CTPNCodeBodyBase::get_or_add_ctx_var_for_level(int level)
{
    /* scan our list to see if the level is already assigned */
    CTcCodeBodyCtx *ctx;
    for (ctx = ctx_head_ ; ctx != 0 ; ctx = ctx->nxt_)
    {
        /* if we've already set up this level, return its variable */
        if (ctx->level_ == level)
            return ctx->var_num_;
    }

    /* we didn't find it - allocate a new level structure */
    ctx = new (G_prsmem) CTcCodeBodyCtx();
    
    /* set up its level and allocate a new variable and property for it */
    ctx->level_ = level;
    ctx->var_num_ = G_prs->alloc_ctx_holder_var();

    /* 
     *   allocating a new variable probably increased the maximum local
     *   variable count - update our information from the parser 
     */
    local_cnt_ = G_prs->get_max_local_cnt();

    /* link it into our list */
    ctx->prv_ = ctx_tail_;
    ctx->nxt_ = 0;
    if (ctx_tail_ != 0)
        ctx_tail_->nxt_ = ctx;
    else
        ctx_head_ = ctx;
    ctx_tail_ = ctx;

    /* return the variable for the new level */
    return ctx->var_num_;
}